

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool __thiscall
tinyusdz::tydra::GetRelationshipNames
          (tydra *this,Prim *prim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_rel_names,string *err)

{
  bool bVar1;
  int iVar2;
  Model *model;
  ostream *poVar3;
  GPrim *gprim;
  Scope *scope;
  GeomMesh *gprim_00;
  undefined1 rel_prop;
  undefined7 uVar4;
  ostringstream ss_e;
  string local_208;
  string local_1e8;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  rel_prop = SUB81(err,0);
  uVar4 = (undefined7)((ulong)err >> 8);
  if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
     (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x401)) {
    if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
       (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x404)) {
      if ((*(undefined8 **)(this + 0x2a8) != (undefined8 *)0x0) &&
         (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 == 0x402)) {
        scope = tinyusdz::value::Value::as<tinyusdz::Scope>((Value *)(this + 0x298),false);
        bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Scope>
                          (scope,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)prim,false,(bool)rel_prop);
        if (bVar1) {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetRelationshipNames",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7d5);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        local_1c8[0] = local_1b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Failed to list up Property names of Prim type {}","");
        local_1e8.field_2._M_allocated_capacity._0_4_ = 0x706f6353;
        local_1e8.field_2._M_local_buf[4] = 'e';
        goto LAB_004f5334;
      }
      if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
         (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x405)) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"GetRelationshipNames",0x14);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7df);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"TODO: Prim type ",0x10);
        if (*(long *)(this + 0x2a8) == 0) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          local_208.field_2._M_allocated_capacity._0_4_ = 0x64696f76;
          local_208._M_string_length = 4;
          local_208.field_2._M_allocated_capacity._4_4_ =
               local_208.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
        }
        else {
          (**(code **)(*(long *)(this + 0x2a8) + 0x10))(&local_208);
        }
        poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                            local_208._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,
                          CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                   local_208.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (out_rel_names !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)out_rel_names,(ulong)local_208._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                     local_208.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
        return false;
      }
      bVar1 = false;
      gprim_00 = tinyusdz::value::Value::as<tinyusdz::GeomMesh>((Value *)(this + 0x298),false);
      if (prim != (Prim *)0x0) {
        bVar1 = anon_unknown_6::GetGPrimPropertyNamesImpl
                          (&gprim_00->super_GPrim,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)prim,false,(bool)rel_prop);
      }
      if (bVar1 != false) {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GetRelationshipNames",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7d6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Failed to list up Property names of Prim type {}","");
      local_1e8.field_2._M_allocated_capacity._0_4_ = 0x6873654d;
      local_1e8._M_string_length = 4;
      local_1e8.field_2._M_local_buf[4] = '\0';
    }
    else {
      bVar1 = false;
      gprim = &tinyusdz::value::Value::as<tinyusdz::Xform>((Value *)(this + 0x298),false)->
               super_GPrim;
      if (prim != (Prim *)0x0) {
        bVar1 = anon_unknown_6::GetGPrimPropertyNamesImpl
                          (gprim,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)prim,false,(bool)rel_prop);
      }
      if (bVar1 != false) {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"GetRelationshipNames",0x14);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7d4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1c8[0] = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Failed to list up Property names of Prim type {}","");
      local_1e8.field_2._M_allocated_capacity._0_4_ = 0x726f6658;
      local_1e8.field_2._M_local_buf[4] = 'm';
      local_1e8.field_2._M_local_buf[5] = '\0';
      local_1e8._M_string_length = 5;
    }
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    fmt::format<std::__cxx11::string>
              (&local_208,(fmt *)local_1c8,&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar4,rel_prop));
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_1e8.field_2._M_local_buf[5],
                                        CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (out_rel_names !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)out_rel_names,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
  }
  else {
    model = tinyusdz::value::Value::as<tinyusdz::Model>((Value *)(this + 0x298),false);
    bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
                      (model,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)prim,false,(bool)rel_prop);
    if (bVar1) {
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
               ,0x5c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"GetRelationshipNames",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x7d3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_1c8[0] = local_1b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"Failed to list up Property names of Prim type {}","");
    local_1e8.field_2._M_allocated_capacity._0_4_ = 0x65646f4d;
    local_1e8.field_2._M_local_buf[4] = 'l';
LAB_004f5334:
    local_1e8.field_2._M_local_buf[5] = '\0';
    local_1e8._M_string_length = 5;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    fmt::format<std::__cxx11::string>
              (&local_208,(fmt *)local_1c8,&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar4,rel_prop));
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT26(local_1e8.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_1e8.field_2._M_local_buf[5],
                                        CONCAT14(local_1e8.field_2._M_local_buf[4],
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (out_rel_names !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)out_rel_names,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
    if (bVar1 != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool GetRelationshipNames(const tinyusdz::Prim &prim,
                          std::vector<std::string> *out_rel_names,
                          std::string *err) {
#define GET_PRIM_RELATIONSHIP_NAMES(__ty)                                 \
  if (prim.is<__ty>()) {                                                  \
    auto ret = GetPrimPropertyNamesImpl(*prim.as<__ty>(), out_rel_names,  \
                                        false, true);                     \
    if (!ret) {                                                           \
      PUSH_ERROR_AND_RETURN(                                              \
          fmt::format("Failed to list up Property names of Prim type {}", \
                      value::TypeTraits<__ty>::type_name()));             \
    }                                                                     \
  } else

  GET_PRIM_RELATIONSHIP_NAMES(Model)
  GET_PRIM_RELATIONSHIP_NAMES(Xform)
  GET_PRIM_RELATIONSHIP_NAMES(Scope)
  GET_PRIM_RELATIONSHIP_NAMES(GeomMesh)
  // GET_PRIM_RELATIONSHIP_NAMES(GeomSubset)
  // GET_PRIM_RELATIONSHIP_NAMES(Shader)
  // GET_PRIM_RELATIONSHIP_NAMES(Material)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelRoot)
  // GET_PRIM_RELATIONSHIP_NAMES(BlendShape)
  // GET_PRIM_RELATIONSHIP_NAMES(Skeleton)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelAnimation)
  {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY_NAMES

  return true;
}